

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O2

void __thiscall Fl_Menu_::replace(Fl_Menu_ *this,int i,char *str)

{
  byte bVar1;
  int iVar2;
  
  if (-1 < i) {
    iVar2 = size(this);
    if (i < iVar2) {
      bVar1 = this->alloc;
      if (bVar1 == 0) {
        copy(this,(EVP_PKEY_CTX *)this->menu_,(EVP_PKEY_CTX *)0x0);
        bVar1 = this->alloc;
      }
      if (1 < bVar1) {
        free(this->menu_[(uint)i].text);
        str = strdup(str);
      }
      this->menu_[(uint)i].text = str;
    }
  }
  return;
}

Assistant:

void Fl_Menu_::replace(int i, const char *str) {
  if (i<0 || i>=size()) return;
  if (!alloc) copy(menu_);
  if (alloc > 1) {
    free((void *)menu_[i].text);
    str = strdup(str);
  }
  menu_[i].text = str;
}